

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel,bool createTestGroup)

{
  DataType DVar1;
  TestNode *node;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *this;
  deInt32 *pdVar4;
  undefined3 in_register_00000089;
  long lVar5;
  SharedPtr variable;
  SharedPtr local_58;
  TestNode *local_48;
  Context *local_40;
  ProgramResourceQueryTestTarget *local_38;
  
  local_48 = &targetGroup->super_TestNode;
  local_40 = context;
  local_38 = queryTarget;
  if (CONCAT31(in_register_00000089,createTestGroup) != 0) {
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,context->m_testCtx,"basic_type","Basic variable");
    local_48 = node;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
  }
  lVar5 = 0;
  do {
    if (generateVariableCases::variableTypes[lVar5].level <= expandLevel) {
      pNVar2 = (Node *)operator_new(0x28);
      DVar1 = generateVariableCases::variableTypes[lVar5].dataType;
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
      pSVar3 = parentStructure->m_state;
      (pNVar2->m_enclosingNode).m_state = pSVar3;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
        *pdVar4 = *pdVar4 + 1;
        UNLOCK();
      }
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
      *(DataType *)&pNVar2[1]._vptr_Node = DVar1;
      local_58.m_state = (SharedPtrStateBase *)0x0;
      local_58.m_ptr = pNVar2;
      pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar3->strongRefCount = 0;
      pSVar3->weakRefCount = 0;
      pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar3->strongRefCount = 1;
      pSVar3->weakRefCount = 1;
      local_58.m_state = pSVar3;
      this = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase(this,local_40,&local_58,local_38,(char *)0x0);
      tcu::TestNode::addChild(local_48,(TestNode *)this);
      pdVar4 = &pSVar3->strongRefCount;
      LOCK();
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &(local_58.m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x19);
  return;
}

Assistant:

static void generateVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel = 3, bool createTestGroup = true)
{
	static const struct
	{
		int				level;
		glu::DataType	dataType;
	} variableTypes[] =
	{
		{ 0,	glu::TYPE_FLOAT			},
		{ 1,	glu::TYPE_INT			},
		{ 1,	glu::TYPE_UINT			},
		{ 1,	glu::TYPE_BOOL			},

		{ 3,	glu::TYPE_FLOAT_VEC2	},
		{ 1,	glu::TYPE_FLOAT_VEC3	},
		{ 1,	glu::TYPE_FLOAT_VEC4	},

		{ 3,	glu::TYPE_INT_VEC2		},
		{ 2,	glu::TYPE_INT_VEC3		},
		{ 3,	glu::TYPE_INT_VEC4		},

		{ 3,	glu::TYPE_UINT_VEC2		},
		{ 2,	glu::TYPE_UINT_VEC3		},
		{ 3,	glu::TYPE_UINT_VEC4		},

		{ 3,	glu::TYPE_BOOL_VEC2		},
		{ 2,	glu::TYPE_BOOL_VEC3		},
		{ 3,	glu::TYPE_BOOL_VEC4		},

		{ 2,	glu::TYPE_FLOAT_MAT2	},
		{ 3,	glu::TYPE_FLOAT_MAT2X3	},
		{ 3,	glu::TYPE_FLOAT_MAT2X4	},
		{ 2,	glu::TYPE_FLOAT_MAT3X2	},
		{ 2,	glu::TYPE_FLOAT_MAT3	},
		{ 3,	glu::TYPE_FLOAT_MAT3X4	},
		{ 2,	glu::TYPE_FLOAT_MAT4X2	},
		{ 3,	glu::TYPE_FLOAT_MAT4X3	},
		{ 2,	glu::TYPE_FLOAT_MAT4	},
	};

	tcu::TestCaseGroup* group;

	if (createTestGroup)
	{
		group = new tcu::TestCaseGroup(context.getTestContext(), "basic_type", "Basic variable");
		targetGroup->addChild(group);
	}
	else
		group = targetGroup;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (variableTypes[ndx].level <= expandLevel)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].dataType));
			group->addChild(new ResourceTestCase(context, variable, queryTarget));
		}
	}
}